

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

void __thiscall asmjit::v1_14::BaseEmitter::onSettingsUpdated(BaseEmitter *this)

{
  FormatFlags FVar1;
  CodeHolder *pCVar2;
  Logger *pLVar3;
  undefined1 uVar4;
  ushort uVar5;
  Error EVar6;
  char c;
  uint uVar7;
  ulong in_RCX;
  void *data;
  long in_RSI;
  undefined1 *puVar8;
  ulong in_R8;
  size_t in_R9;
  size_t size;
  ulong uVar9;
  bool bVar10;
  char *unaff_retaddr;
  undefined8 uStack_2b8;
  ulong uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 *puStack_2a0;
  undefined1 auStack_298 [520];
  
  pCVar2 = this->_code;
  if (pCVar2 == (CodeHolder *)0x0) {
    onSettingsUpdated();
    if (in_RCX < in_R8) {
      EmitterUtils::finishFormattedLine();
      pLVar3 = this->_logger;
      puStack_2a0 = auStack_298;
      uStack_2b0 = 0;
      uStack_2b8 = 0x20;
      uStack_2a8 = 0x207;
      auStack_298[0] = 0;
      FVar1 = (pLVar3->_options)._flags;
      String::_opChars((String *)&uStack_2b8,kAppend,' ',
                       (ulong)(pLVar3->_options)._indentation._data[1]);
      Formatter::formatLabel
                ((String *)&uStack_2b8,(pLVar3->_options)._flags,this,*(uint32_t *)(in_RSI + 4));
      String::_opChar((String *)&uStack_2b8,kAppend,':');
      EmitterUtils::finishFormattedLine
                ((String *)&uStack_2b8,&pLVar3->_options,(uint8_t *)0x0,
                 (ulong)(FVar1 & kMachineCode) - 1,0,0,this->_inlineComment);
      uVar9 = uStack_2b0;
      puVar8 = puStack_2a0;
      if ((uStack_2b8 & 0xff) < 0x1f) {
        uVar9 = uStack_2b8 & 0xff;
        puVar8 = (undefined1 *)((long)&uStack_2b8 + 1);
      }
      (*pLVar3->_vptr_Logger[2])(pLVar3,puVar8,uVar9);
      String::reset((String *)&uStack_2b8);
      return;
    }
    size = 0;
    if (unaff_retaddr == (char *)0x0) {
LAB_0011d8bc:
      if (0xfffffffffffffffd < in_RCX - 1 && size == 0) goto LAB_0011da37;
    }
    else {
      do {
        if (unaff_retaddr[size] == '\0') goto LAB_0011d8bc;
        size = size + 1;
      } while (size != 0x400);
      size = 0x400;
    }
    uVar7 = 0x2c;
    if ((short)*(uint *)(in_RSI + 8) != 0) {
      uVar7 = *(uint *)(in_RSI + 8);
    }
    uVar9 = (ulong)(uVar7 & 0xffff);
    EVar6 = String::padEnd((String *)this,uVar9,' ');
    if (EVar6 == 0) {
      bVar10 = in_RCX != 0xffffffffffffffff;
      c = ';';
      while( true ) {
        EVar6 = String::_opChar((String *)this,kAppend,c);
        if (EVar6 != 0) {
          return;
        }
        EVar6 = String::_opChar((String *)this,kAppend,' ');
        if (EVar6 != 0) {
          return;
        }
        if (!bVar10) break;
        EVar6 = String::_opHex((String *)this,kAppend,data,in_RCX - (in_R9 + in_R8),'\0');
        if (EVar6 != 0) {
          return;
        }
        EVar6 = String::_opChars((String *)this,kAppend,'.',in_R8 * 2);
        if (EVar6 != 0) {
          return;
        }
        EVar6 = String::_opHex((String *)this,kAppend,(void *)((long)data + (in_RCX - in_R9)),in_R9,
                               '\0');
        if (EVar6 != 0) {
          return;
        }
        if (size == 0) goto LAB_0011da37;
        uVar5 = *(ushort *)(in_RSI + 10);
        if (*(ushort *)(in_RSI + 10) == 0) {
          uVar5 = 0x1a;
        }
        uVar9 = uVar9 + uVar5;
        EVar6 = String::padEnd((String *)this,uVar9,' ');
        c = '|';
        bVar10 = false;
        if (EVar6 != 0) {
          return;
        }
      }
      EVar6 = String::_opString((String *)this,kAppend,unaff_retaddr,size);
      if (EVar6 == 0) {
LAB_0011da37:
        String::_opChar((String *)this,kAppend,'\n');
        return;
      }
    }
    return;
  }
  if ((this->_emitterFlags & kOwnLogger) == kNone) {
    this->_logger = pCVar2->_logger;
  }
  if ((this->_emitterFlags & kOwnErrorHandler) == kNone) {
    this->_errorHandler = pCVar2->_errorHandler;
    BaseEmitter_updateForcedOptions(this);
    return;
  }
  if (this->_emitterType == kAssembler) {
    if (this->_code == (CodeHolder *)0x0) {
LAB_0011d238:
      this->_emitterFlags = this->_emitterFlags & ~kLogComments;
      goto LAB_0011d23c;
    }
    uVar4 = (char)this->_diagnosticOptions & kValidateAssembler;
    if (this->_logger != (Logger *)0x0) goto LAB_0011d224;
    this->_emitterFlags = this->_emitterFlags & ~kLogComments;
  }
  else {
    if (this->_code == (CodeHolder *)0x0) goto LAB_0011d238;
    uVar4 = (byte)((char)this->_diagnosticOptions & kValidateIntermediate) >> 1;
LAB_0011d224:
    this->_emitterFlags = this->_emitterFlags | kLogComments;
  }
  if ((uVar4 == kNone) && (this->_logger == (Logger *)0x0)) {
    *(undefined1 *)&this->_forcedInstOptions = (char)this->_forcedInstOptions & 0xfe;
    return;
  }
LAB_0011d23c:
  *(undefined1 *)&this->_forcedInstOptions = (char)this->_forcedInstOptions | kReserved;
  return;
}

Assistant:

void BaseEmitter::onSettingsUpdated() noexcept {
  // Only called when attached to CodeHolder by CodeHolder.
  ASMJIT_ASSERT(_code != nullptr);

  if (!hasOwnLogger())
    _logger = _code->logger();

  if (!hasOwnErrorHandler())
    _errorHandler = _code->errorHandler();

  BaseEmitter_updateForcedOptions(this);
}